

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_13daf71::HandleTransformCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  _Link_type p_Var3;
  cmMakefile *pcVar4;
  TransformAction TVar5;
  size_t __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  code *pcVar8;
  _Base_ptr *pp_Var9;
  _func_int ***ppp_Var10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  _Link_type p_Var17;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Var18;
  string *psVar19;
  int *piVar20;
  long lVar21;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> _Var22;
  undefined8 uVar23;
  undefined **ppuVar24;
  runtime_error *prVar25;
  _Rb_tree_node_base *p_Var26;
  long lVar27;
  pointer pbVar28;
  _Rb_tree_node_base *p_Var29;
  _Link_type __p;
  _Alloc_hider _Var30;
  _Base_ptr p_Var31;
  ulong uVar32;
  _Link_type p_Var33;
  ulong uVar34;
  ulong uVar35;
  _Link_type this;
  _Rb_tree_node_base *p_Var36;
  pointer pbVar37;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view separator;
  string_view value_00;
  string_view separator_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string REGEX;
  string AT;
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  descriptors;
  int value;
  string FOR;
  string OUTPUT_VARIABLE;
  _Link_type local_610;
  _Base_ptr local_600;
  undefined1 local_5e8 [48];
  string local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  long *local_578;
  undefined8 local_570;
  undefined1 local_568;
  undefined7 uStack_567;
  undefined8 uStack_560;
  undefined1 *local_558;
  undefined8 local_550;
  undefined1 local_548;
  undefined7 uStack_547;
  undefined8 uStack_540;
  _Any_data local_538;
  long local_528;
  code *local_520;
  undefined1 local_518 [44];
  uchar auStack_4ec [12];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  undefined1 local_4a0;
  undefined7 uStack_49f;
  undefined8 uStack_498;
  undefined1 *local_490;
  undefined8 local_488;
  undefined1 local_480;
  undefined7 uStack_47f;
  undefined8 uStack_478;
  undefined1 *local_470;
  undefined8 local_468;
  undefined1 local_460;
  undefined7 uStack_45f;
  undefined8 uStack_458;
  char *local_450;
  undefined8 local_448;
  char local_440;
  undefined7 uStack_43f;
  undefined8 uStack_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  undefined8 local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  undefined1 local_410 [32];
  string local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  _Head_base<0UL,_(anonymous_namespace)::TransformAction_*,_false> _Stack_3b8;
  _Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false> local_3b0;
  string local_3a8;
  long *local_388;
  size_t local_380;
  long local_378 [2];
  undefined1 local_368 [8];
  char *pcStack_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  ulong local_348;
  undefined1 local_340 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  code *pcStack_328;
  char *local_320;
  undefined8 local_318;
  char local_310 [8];
  undefined8 uStack_308;
  undefined4 local_300;
  Command *local_2f8;
  undefined8 uStack_2f0;
  code *local_2e8;
  code *local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  undefined4 local_2b8;
  Command *local_2b0;
  undefined8 uStack_2a8;
  code *local_2a0;
  code *local_298;
  undefined1 *local_290;
  undefined8 local_288;
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined4 local_270;
  Command *local_268;
  undefined8 uStack_260;
  code *local_258;
  code *local_250;
  undefined1 *local_248;
  undefined8 local_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined4 local_228;
  Command *local_220;
  undefined8 uStack_218;
  code *local_210;
  code *local_208;
  undefined1 *local_200;
  undefined8 local_1f8;
  undefined1 local_1f0 [8];
  undefined8 uStack_1e8;
  undefined4 local_1e0;
  Command *local_1d8;
  undefined8 uStack_1d0;
  code *local_1c8;
  code *local_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined4 local_198;
  Command *local_190;
  undefined8 uStack_188;
  code *local_180 [3];
  long *local_168;
  size_t local_160;
  long local_158 [2];
  long local_148;
  string local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  code *pcStack_110;
  undefined8 uStack_108;
  Command *local_100;
  undefined8 uStack_f8;
  code *pcStack_f0;
  undefined8 uStack_e8;
  Command *local_e0;
  undefined8 uStack_d8;
  code *pcStack_d0;
  undefined8 uStack_c8;
  Command *local_c0;
  undefined8 uStack_b8;
  code *pcStack_b0;
  undefined8 uStack_a8;
  Command *local_a0;
  undefined8 uStack_98;
  code *pcStack_90;
  undefined8 uStack_88;
  Command *local_80;
  undefined8 uStack_78;
  code *pcStack_70;
  undefined8 uStack_68;
  Command *local_60;
  undefined8 uStack_58;
  code *pcStack_50;
  undefined8 uStack_48;
  cmStringRange local_40;
  
  pbVar28 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar28) < 0x41) {
    local_368 = (undefined1  [8])&local_358;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_368,"sub-command TRANSFORM requires an action to be specified.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_368 != (undefined1  [8])&local_358) {
      operator_delete((void *)local_368,
                      CONCAT26(local_358._M_allocated_capacity._6_2_,
                               CONCAT15(local_358._M_local_buf[5],
                                        CONCAT14(local_358._M_local_buf[4],
                                                 CONCAT13(local_358._M_local_buf[3],
                                                          CONCAT12(local_358._M_local_buf[2],
                                                                   CONCAT11(local_358._M_local_buf
                                                                            [1],local_358.
                                                                                _M_local_buf[0])))))
                              ) + 1);
    }
    return false;
  }
  local_410._0_8_ = &(((Command *)local_410)->Name).field_2;
  local_410._8_8_ = 0;
  local_410[0x10] = '\0';
  local_3f0._M_dataplus._M_p = (pointer)&(((Command *)local_410)->ListName).field_2;
  pcVar2 = pbVar28[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_410)->ListName,pcVar2,pcVar2 + pbVar28[1]._M_string_length
            );
  local_3a8._M_dataplus._M_p = (pointer)&(((Command *)local_410)->OutputName).field_2;
  local_3d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_3b8._M_head_impl = (TransformAction *)0x0;
  local_3d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b0._M_head_impl = (TransformSelector *)0x0;
  pcVar2 = pbVar28[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&((Command *)local_410)->OutputName,pcVar2,
             pcVar2 + pbVar28[1]._M_string_length);
  local_368 = (undefined1  [8])0x0;
  pcStack_360 = (char *)0x0;
  local_358._8_5_ = 0x3a407e;
  local_358._13_2_ = 0;
  local_358._M_local_buf[0xf] = '\0';
  local_358._M_local_buf[0] = -0x68;
  local_358._M_local_buf[1] = '@';
  local_358._M_local_buf[2] = ':';
  local_358._M_local_buf[3] = '\0';
  local_358._M_local_buf[4] = '\0';
  local_358._M_local_buf[5] = '\0';
  local_358._M_allocated_capacity._6_2_ = 0;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_538,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_368);
  local_518._16_8_ = local_518;
  local_518._0_4_ = _S_red;
  local_518._8_8_ = (_Base_ptr)0x0;
  local_518[0x20] = '\0';
  local_518[0x21] = '\0';
  local_518[0x22] = '\0';
  local_518[0x23] = '\0';
  local_518[0x24] = '\0';
  local_518[0x25] = '\0';
  local_518[0x26] = '\0';
  local_518[0x27] = '\0';
  pcVar8 = (code *)CONCAT26(local_358._M_allocated_capacity._6_2_,
                            CONCAT15(local_358._M_local_buf[5],
                                     CONCAT14(local_358._M_local_buf[4],
                                              CONCAT13(local_358._M_local_buf[3],
                                                       CONCAT12(local_358._M_local_buf[2],
                                                                CONCAT11(local_358._M_local_buf[1],
                                                                         local_358._M_local_buf[0]))
                                                      ))));
  local_518._24_8_ = local_518._16_8_;
  if (pcVar8 != (code *)0x0) {
    (*pcVar8)(local_368,local_368,3);
  }
  local_430 = &local_420;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"APPEND","");
  uStack_58 = 0;
  local_368 = (undefined1  [8])&local_358;
  local_358._M_local_buf[2] = (char)((uint7)local_420._1_7_ >> 8);
  local_358._M_local_buf[3] = (char)((uint7)local_420._1_7_ >> 0x10);
  local_358._M_local_buf[4] = (char)((uint7)local_420._1_7_ >> 0x18);
  local_358._M_local_buf[5] = (char)((uint7)local_420._1_7_ >> 0x20);
  local_358._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_420._1_7_ >> 0x28);
  if (local_430 == &local_420) {
    local_358._8_5_ = (undefined5)local_420._8_8_;
    local_358._13_2_ = (undefined2)((ulong)local_420._8_8_ >> 0x28);
    local_358._M_local_buf[0xf] = (char)((ulong)local_420._8_8_ >> 0x38);
  }
  else {
    local_368 = (undefined1  [8])local_430;
  }
  local_358._M_local_buf[1] = (char)local_420._M_allocated_capacity._1_7_;
  pcStack_360 = (char *)local_428;
  local_428 = 0;
  local_420._M_local_buf[0] = '\0';
  local_348 = CONCAT44(local_348._4_4_,1);
  pcStack_328 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:817:21)>
                ::_M_invoke;
  paStack_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:817:21)>
                 ::_M_manager;
  pcStack_50 = (code *)0x0;
  uStack_48 = 0;
  local_450 = &local_440;
  local_430 = &local_420;
  local_340 = (undefined1  [8])local_410;
  local_60 = (Command *)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"PREPEND","");
  uStack_78 = 0;
  local_320 = local_310;
  if (local_450 == &local_440) {
    uStack_308 = uStack_438;
  }
  else {
    local_320 = local_450;
  }
  local_318 = local_448;
  local_448 = 0;
  local_440 = '\0';
  local_300 = 1;
  local_2e0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:825:21)>
              ::_M_invoke;
  uStack_2f0 = 0;
  local_2e8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:825:21)>
              ::_M_manager;
  pcStack_70 = (code *)0x0;
  uStack_68 = 0;
  local_470 = &local_460;
  local_450 = &local_440;
  local_2f8 = (Command *)local_410;
  local_80 = (Command *)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"TOUPPER","");
  uStack_98 = 0;
  local_2d8 = local_2c8;
  if (local_470 == &local_460) {
    uStack_2c0 = uStack_458;
  }
  else {
    local_2d8 = local_470;
  }
  local_2d0 = local_468;
  local_468 = 0;
  local_460 = 0;
  local_2b8 = 0;
  local_298 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:833:21)>
              ::_M_invoke;
  uStack_2a8 = 0;
  local_2a0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:833:21)>
              ::_M_manager;
  pcStack_90 = (code *)0x0;
  uStack_88 = 0;
  local_558 = &local_548;
  local_470 = &local_460;
  local_2b0 = (Command *)local_410;
  local_a0 = (Command *)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"TOLOWER","");
  uStack_b8 = 0;
  local_290 = local_280;
  if (local_558 == &local_548) {
    uStack_278 = uStack_540;
  }
  else {
    local_290 = local_558;
  }
  local_288 = local_550;
  local_550 = 0;
  local_548 = 0;
  local_270 = 0;
  local_250 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:841:21)>
              ::_M_invoke;
  uStack_260 = 0;
  local_258 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:841:21)>
              ::_M_manager;
  pcStack_b0 = (code *)0x0;
  uStack_a8 = 0;
  local_558 = &local_548;
  local_490 = &local_480;
  local_268 = (Command *)local_410;
  local_c0 = (Command *)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"STRIP","");
  uStack_d8 = 0;
  local_248 = local_238;
  if (local_490 == &local_480) {
    uStack_230 = uStack_478;
  }
  else {
    local_248 = local_490;
  }
  local_240 = local_488;
  local_488 = 0;
  local_480 = 0;
  local_228 = 0;
  local_208 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:849:21)>
              ::_M_invoke;
  uStack_218 = 0;
  local_210 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:849:21)>
              ::_M_manager;
  pcStack_d0 = (code *)0x0;
  uStack_c8 = 0;
  local_4b0._M_allocated_capacity = (size_type)&local_4a0;
  local_490 = &local_480;
  local_220 = (Command *)local_410;
  local_e0 = (Command *)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"GENEX_STRIP","");
  uStack_f8 = 0;
  local_200 = local_1f0;
  if ((undefined1 *)local_4b0._M_allocated_capacity == &local_4a0) {
    uStack_1e8 = uStack_498;
  }
  else {
    local_200 = (undefined1 *)local_4b0._M_allocated_capacity;
  }
  local_1f8 = local_4b0._8_8_;
  local_4b0._8_8_ = 0;
  local_4a0 = 0;
  local_1e0 = 0;
  local_1c0 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:857:21)>
              ::_M_invoke;
  uStack_1d0 = 0;
  local_1c8 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:857:21)>
              ::_M_manager;
  pcStack_f0 = (code *)0x0;
  uStack_e8 = 0;
  __p = (_Link_type)0x781fd6;
  local_578 = (long *)&local_568;
  local_4b0._M_allocated_capacity = (size_type)&local_4a0;
  local_1d8 = (Command *)local_410;
  local_100 = (Command *)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"REPLACE","");
  local_120._8_8_ = 0;
  local_1b8[0] = local_1a8;
  if (local_578 == (long *)&local_568) {
    local_1a8[1] = uStack_560;
  }
  else {
    local_1b8[0] = local_578;
  }
  local_1b8[1] = (long *)local_570;
  local_570 = 0;
  local_568 = 0;
  local_198 = 2;
  local_180[1] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:867:21)>
                 ::_M_invoke;
  uStack_188 = 0;
  local_180[0] = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmListCommand.cxx:867:21)>
                 ::_M_manager;
  pcStack_110 = (code *)0x0;
  uStack_108 = 0;
  local_600 = (_Base_ptr)local_518._8_8_;
  if ((_Base_ptr)local_518._8_8_ == (_Base_ptr)0x0) {
    this = (_Link_type)0x0;
  }
  else {
    *(_Base_ptr *)(local_518._8_8_ + 8) = (_Base_ptr)0x0;
    this = (_Link_type)((_Rb_tree_node_base *)local_518._24_8_)->_M_left;
    if (this == (_Link_type)0x0) {
      this = (_Link_type)local_518._24_8_;
    }
  }
  local_518._8_8_ = (_Rb_tree_node_base *)0x0;
  local_518._16_8_ = local_518;
  local_518._32_8_ = 0;
  lVar27 = 0;
  local_578 = (long *)&local_568;
  local_518._24_8_ = local_518._16_8_;
  local_190 = (Command *)local_410;
  local_120._M_allocated_capacity = (size_type)(Command *)local_410;
  do {
    p_Var33 = (_Link_type)(local_368 + lVar27);
    if (local_518._32_8_ == 0) {
LAB_0039fd52:
      p_Var26 = (_Rb_tree_node_base *)local_518;
      p_Var31 = (_Base_ptr)local_518._8_8_;
      if ((_Rb_tree_node_base *)local_518._8_8_ == (_Rb_tree_node_base *)0x0) {
LAB_0039fda3:
        if (p_Var26 != (_Rb_tree_node_base *)local_518._16_8_) {
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var26);
          goto LAB_0039fdb8;
        }
LAB_0039fded:
        bVar12 = false;
      }
      else {
        do {
          p_Var26 = p_Var31;
          if (local_528 == 0) goto LAB_003a132c;
          __p = p_Var33;
          bVar12 = (*local_520)(&local_538,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )p_Var33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(p_Var26 + 1));
          p_Var31 = (&p_Var26->_M_left)[!bVar12];
        } while ((&p_Var26->_M_left)[!bVar12] != (_Base_ptr)0x0);
        p_Var16 = p_Var26;
        if (bVar12) goto LAB_0039fda3;
LAB_0039fdb8:
        if (local_528 == 0) {
LAB_003a132c:
          std::__throw_bad_function_call();
        }
        __p = (_Link_type)(p_Var16 + 1);
        bVar12 = (*local_520)(&local_538,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __p,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)p_Var33);
        if (!bVar12) goto LAB_0039ff0d;
        bVar12 = p_Var16 != (_Rb_tree_node_base *)0x0 && !bVar12;
      }
      bVar13 = true;
      if ((!bVar12) && ((_Rb_tree_node_base *)local_518 != p_Var26)) {
        if (local_528 == 0) {
LAB_003a133e:
          std::__throw_bad_function_call();
        }
        __p = p_Var33;
        bVar13 = (*local_520)(&local_538,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              p_Var33,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(p_Var26 + 1));
      }
      if (this == (_Link_type)0x0) {
        __p = (_Link_type)operator_new(0x68);
        local_610 = (_Link_type)0x0;
      }
      else {
        local_610 = (_Link_type)(this->super__Rb_tree_node_base)._M_parent;
        if (local_610 == (_Link_type)0x0) {
          local_600 = (_Base_ptr)0x0;
          local_610 = (_Link_type)0x0;
        }
        else if ((_Link_type)(local_610->super__Rb_tree_node_base)._M_right == this) {
          (local_610->super__Rb_tree_node_base)._M_right = (_Base_ptr)0x0;
          p_Var3 = (_Link_type)(local_610->super__Rb_tree_node_base)._M_left;
          if (p_Var3 != (_Link_type)0x0) {
            do {
              p_Var17 = p_Var3;
              p_Var3 = (_Link_type)(p_Var17->super__Rb_tree_node_base)._M_right;
            } while (p_Var3 != (_Link_type)0x0);
            local_610 = (_Link_type)(p_Var17->super__Rb_tree_node_base)._M_left;
            if (local_610 == (_Link_type)0x0) {
              local_610 = p_Var17;
            }
          }
        }
        else {
          (local_610->super__Rb_tree_node_base)._M_left = (_Base_ptr)0x0;
        }
        std::
        _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
        ::_M_destroy_node((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                           *)this,__p);
        __p = this;
      }
      *(uchar **)(__p->_M_storage)._M_storage = (__p->_M_storage)._M_storage + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__p->_M_storage,*(long *)&p_Var33->super__Rb_tree_node_base,
                 *(long *)((long)&pcStack_360 + lVar27) +
                 *(long *)&p_Var33->super__Rb_tree_node_base);
      *(undefined4 *)((__p->_M_storage)._M_storage + 0x20) =
           *(undefined4 *)((long)&local_348 + lVar27);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)((__p->_M_storage)._M_storage + 0x28),
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)(local_340 + lVar27));
      std::_Rb_tree_insert_and_rebalance
                (bVar13,&__p->super__Rb_tree_node_base,p_Var26,(_Rb_tree_node_base *)local_518);
      local_518._32_8_ = local_518._32_8_ + 1;
      this = local_610;
    }
    else {
      if (local_528 == 0) goto LAB_003a133e;
      __p = (_Link_type)(local_518._24_8_ + 0x20);
      bVar12 = (*local_520)(&local_538,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__p
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var33);
      if (!bVar12) goto LAB_0039fd52;
      p_Var26 = (_Rb_tree_node_base *)local_518._24_8_;
      if ((_Rb_tree_node_base *)local_518._24_8_ != (_Rb_tree_node_base *)0x0) goto LAB_0039fded;
    }
LAB_0039ff0d:
    lVar27 = lVar27 + 0x48;
  } while (lVar27 != 0x1f8);
  std::
  _Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::_M_erase((_Rb_tree<ActionDescriptor,_ActionDescriptor,_std::_Identity<ActionDescriptor>,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
              *)local_600,__p);
  lVar27 = 0;
  do {
    if (*(code **)((long)local_180 + lVar27) != (code *)0x0) {
      (**(code **)((long)local_180 + lVar27))((long)&local_190 + lVar27,(long)&local_190 + lVar27,3)
      ;
    }
    if ((void *)((long)local_1a8 + lVar27) != *(void **)((long)local_1b8 + lVar27)) {
      operator_delete(*(void **)((long)local_1b8 + lVar27),*(long *)((long)local_1a8 + lVar27) + 1);
    }
    lVar27 = lVar27 + -0x48;
  } while (lVar27 != -0x1f8);
  if (pcStack_110 != (code *)0x0) {
    (*pcStack_110)(&local_120,&local_120,3);
  }
  if (local_578 != (long *)&local_568) {
    operator_delete(local_578,CONCAT71(uStack_567,local_568) + 1);
  }
  if (pcStack_f0 != (code *)0x0) {
    (*pcStack_f0)(&local_100,&local_100,3);
  }
  if ((undefined1 *)local_4b0._M_allocated_capacity != &local_4a0) {
    operator_delete((void *)local_4b0._M_allocated_capacity,CONCAT71(uStack_49f,local_4a0) + 1);
  }
  if (pcStack_d0 != (code *)0x0) {
    (*pcStack_d0)(&local_e0,&local_e0,3);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490,CONCAT71(uStack_47f,local_480) + 1);
  }
  if (pcStack_b0 != (code *)0x0) {
    (*pcStack_b0)(&local_c0,&local_c0,3);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,CONCAT71(uStack_547,local_548) + 1);
  }
  if (pcStack_90 != (code *)0x0) {
    (*pcStack_90)(&local_a0,&local_a0,3);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,CONCAT71(uStack_45f,local_460) + 1);
  }
  if (pcStack_70 != (code *)0x0) {
    (*pcStack_70)(&local_80,&local_80,3);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,CONCAT71(uStack_43f,local_440) + 1);
  }
  if (pcStack_50 != (code *)0x0) {
    (*pcStack_50)(&local_60,&local_60,3);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430,
                    CONCAT71(local_420._M_allocated_capacity._1_7_,local_420._M_local_buf[0]) + 1);
  }
  pbVar28 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar28[2]._M_dataplus._M_p;
  local_4d0._M_allocated_capacity = (size_type)&local_4c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,pcVar2,pcVar2 + pbVar28[2]._M_string_length);
  local_358._M_local_buf[2] = (char)((uint7)local_4c0._1_7_ >> 8);
  local_358._M_local_buf[3] = (char)((uint7)local_4c0._1_7_ >> 0x10);
  local_358._M_local_buf[4] = (char)((uint7)local_4c0._1_7_ >> 0x18);
  local_358._M_local_buf[5] = (char)((uint7)local_4c0._1_7_ >> 0x20);
  local_358._M_allocated_capacity._6_2_ = (undefined2)((uint7)local_4c0._1_7_ >> 0x28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_allocated_capacity == &local_4c0) {
    local_358._8_5_ = (undefined5)local_4c0._8_8_;
    local_358._13_2_ = (undefined2)((ulong)local_4c0._8_8_ >> 0x28);
    local_358._M_local_buf[0xf] = (char)((ulong)local_4c0._8_8_ >> 0x38);
    local_368 = (undefined1  [8])&local_358;
  }
  else {
    local_368 = (undefined1  [8])local_4d0._M_allocated_capacity;
  }
  local_358._M_local_buf[1] = (char)local_4c0._M_allocated_capacity._1_7_;
  local_358._M_local_buf[0] = local_4c0._M_local_buf[0];
  pcStack_360 = (char *)local_4d0._8_8_;
  local_4d0._M_local_buf[8] = '\0';
  local_4d0._M_local_buf[9] = '\0';
  local_4d0._M_local_buf[10] = '\0';
  local_4d0._M_local_buf[0xb] = '\0';
  local_4d0._M_local_buf[0xc] = '\0';
  local_4d0._M_local_buf[0xd] = '\0';
  local_4d0._M_local_buf[0xe] = '\0';
  local_4d0._M_local_buf[0xf] = '\0';
  local_4c0._M_local_buf[0] = '\0';
  local_348 = local_348 & 0xffffffff00000000;
  local_340 = (undefined1  [8])0x0;
  paStack_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  pcStack_328 = (code *)0x0;
  p_Var26 = (_Rb_tree_node_base *)local_518;
  local_4d0._M_allocated_capacity = (size_type)&local_4c0;
  if ((_Rb_tree_node_base *)local_518._8_8_ != (_Rb_tree_node_base *)0x0) {
    p_Var16 = (_Rb_tree_node_base *)local_518;
    p_Var31 = (_Base_ptr)local_518._8_8_;
    do {
      p_Var29 = p_Var16;
      if (local_528 == 0) goto LAB_003a1343;
      p_Var36 = p_Var31 + 1;
      bVar12 = (*local_520)(&local_538,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            p_Var36,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_368);
      pp_Var9 = &p_Var31->_M_left;
      p_Var16 = p_Var31;
      if (bVar12) {
        p_Var16 = p_Var29;
      }
      p_Var31 = pp_Var9[bVar12];
    } while (pp_Var9[bVar12] != (_Base_ptr)0x0);
    p_Var26 = (_Rb_tree_node_base *)local_518;
    if (p_Var16 != (_Rb_tree_node_base *)local_518) {
      if (local_528 == 0) {
LAB_003a1343:
        std::__throw_bad_function_call();
      }
      if (bVar12) {
        p_Var36 = p_Var29 + 1;
      }
      bVar12 = (*local_520)(&local_538,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_368,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            p_Var36);
      p_Var26 = p_Var16;
      if (bVar12) {
        p_Var26 = (_Rb_tree_node_base *)local_518;
      }
    }
  }
  if (local_330 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (*(code *)local_330)(local_340,local_340,3);
  }
  if (local_368 != (undefined1  [8])&local_358) {
    operator_delete((void *)local_368,
                    CONCAT26(local_358._M_allocated_capacity._6_2_,
                             CONCAT15(local_358._M_local_buf[5],
                                      CONCAT14(local_358._M_local_buf[4],
                                               CONCAT13(local_358._M_local_buf[3],
                                                        CONCAT12(local_358._M_local_buf[2],
                                                                 CONCAT11(local_358._M_local_buf[1],
                                                                          local_358._M_local_buf[0])
                                                                ))))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_allocated_capacity != &local_4c0) {
    operator_delete((void *)local_4d0._M_allocated_capacity,
                    CONCAT71(local_4c0._M_allocated_capacity._1_7_,local_4c0._M_local_buf[0]) + 1);
  }
  if (p_Var26 == (_Rb_tree_node_base *)local_518) {
    pbVar28 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = pbVar28[2]._M_dataplus._M_p;
    sVar7 = pbVar28[2]._M_string_length;
    local_368 = (undefined1  [8])0x18;
    pcStack_360 = " sub-command TRANSFORM, ";
    local_358._M_local_buf[0] = (char)sVar7;
    local_358._M_local_buf[1] = (char)(sVar7 >> 8);
    local_358._M_local_buf[2] = (char)(sVar7 >> 0x10);
    local_358._M_local_buf[3] = (char)(sVar7 >> 0x18);
    local_358._M_local_buf[4] = (char)(sVar7 >> 0x20);
    local_358._M_local_buf[5] = (char)(sVar7 >> 0x28);
    local_358._M_allocated_capacity._6_2_ = (undefined2)(sVar7 >> 0x30);
    local_358._8_5_ = SUB85(pcVar2,0);
    local_358._13_2_ = (undefined2)((ulong)pcVar2 >> 0x28);
    local_358._M_local_buf[0xf] = (char)((ulong)pcVar2 >> 0x38);
    local_348 = 0x10;
    local_340 = (undefined1  [8])0x7794a9;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_368;
    cmCatViews_abi_cxx11_((string *)local_5e8,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_5b8.field_2._M_allocated_capacity = local_5e8._16_8_;
    _Var30._M_p = (pointer)local_5e8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_5e8 + 0x10)) {
LAB_003a04b4:
      operator_delete(_Var30._M_p,
                      (ulong)((long)&(((pointer)local_5b8.field_2._M_allocated_capacity)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  else {
    if ((long)(int)p_Var26[2]._M_color + 3U <=
        (ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)local_410);
      uVar34 = (long)(int)p_Var26[2]._M_color + 3;
      if (0 < (long)(int)p_Var26[2]._M_color) {
        pbVar28 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5e8,
                   pbVar28 + 3,pbVar28 + uVar34,(allocator_type *)&local_5b8);
        pbVar28 = local_3d0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pcStack_360 = (char *)local_3d0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        local_368 = (undefined1  [8])
                    local_3d0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_3d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_5e8._16_8_;
        local_3d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_5e8._0_8_;
        local_3d0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_5e8._8_8_;
        local_358._M_local_buf[0] = (char)pbVar28;
        local_358._M_local_buf[1] = (char)((ulong)pbVar28 >> 8);
        local_358._M_local_buf[2] = (char)((ulong)pbVar28 >> 0x10);
        local_358._M_local_buf[3] = (char)((ulong)pbVar28 >> 0x18);
        local_358._M_local_buf[4] = (char)((ulong)pbVar28 >> 0x20);
        local_358._M_local_buf[5] = (char)((ulong)pbVar28 >> 0x28);
        local_358._M_allocated_capacity._6_2_ = (undefined2)((ulong)pbVar28 >> 0x30);
        local_5e8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_5e8._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_5e8._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_368);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5e8);
      }
      iVar14 = std::__cxx11::string::compare((char *)local_410);
      _Var18._M_head_impl = (TransformAction *)_Stack_3b8;
      if (iVar14 == 0) {
        pcVar4 = status->Makefile;
        _Var18._M_head_impl = (TransformAction *)operator_new(0x160);
        pbVar28 = local_3d0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *_Var18._M_head_impl = (TransformAction)&PTR__TransformReplace_009505e0;
        local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_5b8,
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_3d0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity,
                   *(long *)((long)local_3d0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x28) +
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_3d0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0x20))->
                   _M_allocated_capacity);
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)((long)_Var18._M_head_impl + 8),pbVar28,&local_5b8,
                   pcVar4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
          operator_delete(local_5b8._M_dataplus._M_p,
                          (ulong)(local_5b8.field_2._M_allocated_capacity + 1));
        }
        cmMakefile::ClearMatches(pcVar4);
        if (((TransformAction *)((long)_Var18._M_head_impl + 0x108))->_vptr_TransformAction ==
            (_func_int **)0x0) {
LAB_003a1378:
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_368 = (undefined1  [8])0x40;
          pcStack_360 = "sub-command TRANSFORM, action REPLACE: Failed to compile regex \"";
          local_5e8._8_8_ =
               (local_3d0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus;
          local_5e8._0_8_ =
               *(undefined8 *)
                ((long)local_3d0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 8);
          cmStrCat<char[3]>((string *)&local_598,(cmAlphaNum *)local_368,(cmAlphaNum *)local_5e8,
                            (char (*) [3])0x7562ec);
          std::runtime_error::runtime_error(prVar25,(string *)local_598._M_local_buf);
          *(undefined ***)prVar25 = &PTR__runtime_error_00950630;
          __cxa_throw(prVar25,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (*(char *)&((TransformAction *)((long)_Var18._M_head_impl + 0x118))->
                      _vptr_TransformAction == '\0') {
          prVar25 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_368 = (undefined1  [8])0x27;
          pcStack_360 = "sub-command TRANSFORM, action REPLACE: ";
          local_5e8._8_8_ =
               ((TransformAction *)((long)_Var18._M_head_impl + 8))->_vptr_TransformAction;
          local_5e8._0_8_ =
               ((TransformAction *)((long)_Var18._M_head_impl + 0x10))->_vptr_TransformAction;
          cmStrCat<char[2]>((string *)&local_598,(cmAlphaNum *)local_368,(cmAlphaNum *)local_5e8,
                            (char (*) [2])0x755914);
          std::runtime_error::runtime_error(prVar25,(string *)local_598._M_local_buf);
          *(undefined ***)prVar25 = &PTR__runtime_error_00950630;
          __cxa_throw(prVar25,&(anonymous_namespace)::transform_error::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
             )_Stack_3b8._M_head_impl != (TransformAction *)0x0) {
          TVar5._vptr_TransformAction = (_Stack_3b8._M_head_impl)->_vptr_TransformAction;
          _Stack_3b8._M_head_impl = _Var18._M_head_impl;
          (*TVar5._vptr_TransformAction[1])();
          _Var18._M_head_impl = (TransformAction *)_Stack_3b8;
        }
      }
      _Stack_3b8._M_head_impl = _Var18._M_head_impl;
      local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"REGEX","");
      local_598._M_allocated_capacity = (size_type)&local_588;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"AT","");
      local_388 = local_378;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"FOR","");
      local_168 = local_158;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"OUTPUT_VARIABLE","");
      pbVar37 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar28 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar32 = (long)pbVar28 - (long)pbVar37 >> 5;
      if (uVar34 < uVar32) {
        psVar19 = &status->Error;
        do {
          sVar7 = local_5b8._M_string_length;
          lVar27 = uVar34 * 0x20;
          pbVar1 = pbVar37 + uVar34;
          __n = pbVar37[uVar34]._M_string_length;
          if (((__n == local_5b8._M_string_length) &&
              ((__n == 0 ||
               (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_5b8._M_dataplus._M_p,__n),
               iVar14 == 0)))) ||
             ((__n == local_598._8_8_ &&
              ((__n == 0 ||
               (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,(void *)local_598._M_allocated_capacity,__n
                             ), iVar14 == 0)))))) {
LAB_003a07b0:
            if (local_3b0._M_head_impl == (TransformSelector *)0x0) goto LAB_003a07c1;
LAB_003a1066:
            pcVar2 = (((string *)((long)local_3b0._M_head_impl + 8))->_M_dataplus)._M_p;
            sVar7 = *(size_type *)((long)local_3b0._M_head_impl + 0x10);
            local_368 = (undefined1  [8])0x33;
            pcStack_360 = "sub-command TRANSFORM, selector already specified (";
            local_358._M_local_buf[0] = (char)sVar7;
            local_358._M_local_buf[1] = (char)(sVar7 >> 8);
            local_358._M_local_buf[2] = (char)(sVar7 >> 0x10);
            local_358._M_local_buf[3] = (char)(sVar7 >> 0x18);
            local_358._M_local_buf[4] = (char)(sVar7 >> 0x20);
            local_358._M_local_buf[5] = (char)(sVar7 >> 0x28);
            local_358._M_allocated_capacity._6_2_ = (undefined2)(sVar7 >> 0x30);
            local_358._8_5_ = SUB85(pcVar2,0);
            local_358._13_2_ = (undefined2)((ulong)pcVar2 >> 0x28);
            local_358._M_local_buf[0xf] = (char)((ulong)pcVar2 >> 0x38);
            local_348 = 2;
            local_340 = (undefined1  [8])0x75e3de;
            views_01._M_len = 3;
            views_01._M_array = (iterator)local_368;
            cmCatViews_abi_cxx11_((string *)local_5e8,views_01);
            std::__cxx11::string::_M_assign((string *)psVar19);
            local_4e0._M_allocated_capacity = local_5e8._16_8_;
            local_140._M_dataplus._M_p = (pointer)local_5e8._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e8._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_5e8 + 0x10)) goto LAB_003a191f;
LAB_003a1917:
            operator_delete(local_140._M_dataplus._M_p,
                            (ulong)((long)&(((pointer)local_4e0._M_allocated_capacity)->_M_dataplus)
                                           ._M_p + 1));
LAB_003a191f:
            bVar12 = false;
            goto LAB_003a1921;
          }
          if (__n == local_380) {
            if (__n == 0) goto LAB_003a07b0;
            iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_388,__n);
            if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)
                local_3b0._M_head_impl ==
                (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0 ||
                iVar14 != 0) goto LAB_003a07c1;
            goto LAB_003a1066;
          }
LAB_003a07c1:
          if ((__n == sVar7) &&
             ((__n == 0 ||
              (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_5b8._M_dataplus._M_p,__n), iVar14 == 0
              )))) {
            uVar35 = uVar34 + 1;
            if (uVar32 == uVar35) {
              local_368 = (undefined1  [8])&local_358;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_368,
                         "sub-command TRANSFORM, selector REGEX expects \'regular expression\' argument."
                         ,"");
              std::__cxx11::string::_M_assign((string *)psVar19);
LAB_003a12e1:
              if (local_368 != (undefined1  [8])&local_358) goto LAB_003a190f;
            }
            else {
              _Var22._M_head_impl = (TransformSelector *)operator_new(0xf8);
              local_368 = (undefined1  [8])&local_358;
              local_358._M_local_buf[4] = 'X';
              local_358._M_local_buf[0] = 'R';
              local_358._M_local_buf[1] = 'E';
              local_358._M_local_buf[2] = 'G';
              local_358._M_local_buf[3] = 'E';
              pcStack_360 = (char *)0x5;
              local_358._M_local_buf[5] = '\0';
              (((string *)((long)_Var22._M_head_impl + 8))->_M_dataplus)._M_p =
                   (pointer)((long)_Var22._M_head_impl + 0x18);
              *(undefined4 *)((long)_Var22._M_head_impl + 0x18) = 0x45474552;
              *(undefined1 *)((long)_Var22._M_head_impl + 0x1c) = 0x58;
              *(ulong *)((long)_Var22._M_head_impl + 0x1d) =
                   (ulong)CONCAT52(local_358._8_5_,local_358._M_allocated_capacity._6_2_) << 8;
              *(undefined2 *)((long)_Var22._M_head_impl + 0x25) = local_358._13_2_;
              *(char *)((long)_Var22._M_head_impl + 0x27) = local_358._M_local_buf[0xf];
              *(size_type *)((long)_Var22._M_head_impl + 0x10) = 5;
              *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorRegex_00950658;
              *(size_type *)((long)_Var22._M_head_impl + 0xd8) = 0;
              *(long *)((long)_Var22._M_head_impl + 0xe8) = 0;
              *(undefined4 *)
               &((TransformSelector *)((long)_Var22._M_head_impl + 0xf0))->_vptr_TransformSelector =
                   0;
              memset((RegularExpression *)((long)_Var22._M_head_impl + 0x28),0,0xaa);
              cmsys::RegularExpression::compile
                        ((RegularExpression *)((long)_Var22._M_head_impl + 0x28),
                         pbVar37[uVar35]._M_dataplus._M_p);
              if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                   )local_3b0._M_head_impl != (TransformSelector *)0x0) {
                lVar27 = *(long *)local_3b0._M_head_impl;
                local_3b0._M_head_impl = _Var22._M_head_impl;
                (**(code **)(lVar27 + 8))();
                _Var22._M_head_impl = local_3b0._M_head_impl;
              }
              local_3b0._M_head_impl = _Var22._M_head_impl;
              iVar14 = (*(local_3b0._M_head_impl)->_vptr_TransformSelector[2])
                                 (local_3b0._M_head_impl);
              if ((char)iVar14 != '\0') {
LAB_003a09c2:
                uVar35 = uVar34 + 2;
                _Var22._M_head_impl = local_3b0._M_head_impl;
                goto LAB_003a0e64;
              }
              local_368 = (undefined1  [8])0x3f;
              pcStack_360 = "sub-command TRANSFORM, selector REGEX failed to compile regex \"";
              pbVar28 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              local_5e8._8_8_ = pbVar28[uVar35]._M_dataplus._M_p;
              local_5e8._0_8_ = pbVar28[uVar35]._M_string_length;
              cmStrCat<char[3]>((string *)(local_518 + 0x28),(cmAlphaNum *)local_368,
                                (cmAlphaNum *)local_5e8,(char (*) [3])0x7562ec);
              std::__cxx11::string::_M_assign((string *)psVar19);
              local_140._M_dataplus._M_p = (pointer)CONCAT44(auStack_4ec._0_4_,local_518._40_4_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_4e0) goto LAB_003a1917;
            }
            goto LAB_003a191f;
          }
          if ((__n != local_598._8_8_) ||
             ((__n != 0 &&
              (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,(void *)local_598._M_allocated_capacity,__n)
              , iVar14 != 0)))) {
            if ((__n == local_380) &&
               ((__n == 0 || (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_388,__n), iVar14 == 0))
               )) {
              uVar35 = uVar34 + 2;
              if (uVar32 <= uVar35) {
                local_368 = (undefined1  [8])&local_358;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_368,
                           "sub-command TRANSFORM, selector FOR expects, at least, two arguments.",
                           "");
                std::__cxx11::string::_M_assign((string *)psVar19);
                goto LAB_003a12e1;
              }
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)pbVar37[uVar34 + 1]._M_dataplus._M_p;
              piVar20 = __errno_location();
              iVar14 = *piVar20;
              *piVar20 = 0;
              lVar27 = strtol(paVar6->_M_local_buf,(char **)local_368,10);
              if (local_368 == (undefined1  [8])paVar6) {
                std::__throw_invalid_argument("stoi");
LAB_003a1360:
                std::__throw_out_of_range("stoi");
              }
              if ((lVar27 - 0x80000000U < 0xffffffff00000000) || (iVar15 = *piVar20, iVar15 == 0x22)
                 ) {
                std::__throw_out_of_range("stoi");
              }
              if (iVar15 == 0) {
                *piVar20 = iVar14;
                iVar15 = iVar14;
              }
              pbVar28 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              if ((long)local_368 - (long)paVar6 == pbVar28[uVar34 + 1]._M_string_length) {
                paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)pbVar28[uVar35]._M_dataplus._M_p;
                *piVar20 = 0;
                lVar21 = strtol(paVar6->_M_local_buf,(char **)local_368,10);
                if (local_368 == (undefined1  [8])paVar6) {
                  std::__throw_invalid_argument("stoi");
                  goto LAB_003a1378;
                }
                local_148 = lVar21;
                if ((lVar21 - 0x80000000U < 0xffffffff00000000) ||
                   (iVar14 = *piVar20, iVar14 == 0x22)) goto LAB_003a1360;
                if (iVar14 == 0) {
                  *piVar20 = iVar15;
                  iVar14 = iVar15;
                }
                pbVar28 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_368 - (long)paVar6 == pbVar28[uVar35]._M_string_length) {
                  uVar35 = uVar34 + 3;
                  iVar15 = 1;
                  if (uVar35 < (ulong)((long)(args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar28 >> 5)) {
                    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)pbVar28[uVar35]._M_dataplus._M_p;
                    *piVar20 = 0;
                    lVar21 = strtol(paVar6->_M_local_buf,(char **)local_368,10);
                    if (local_368 == (undefined1  [8])paVar6) {
                      uVar23 = std::__throw_invalid_argument("stoi");
LAB_003a148e:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5e8._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
                        operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ - local_5e8._0_8_);
                      }
                      if (local_168 != local_158) {
                        operator_delete(local_168,local_158[0] + 1);
                      }
                      if (local_388 != local_378) {
                        operator_delete(local_388,local_378[0] + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._M_allocated_capacity != &local_588) {
                        operator_delete((void *)local_598._M_allocated_capacity,
                                        local_588._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
                        operator_delete(local_5b8._M_dataplus._M_p,
                                        (ulong)(local_5b8.field_2._M_allocated_capacity + 1));
                      }
                      std::
                      set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                      ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
                              *)&local_538);
                      HandleTransformCommand::Command::~Command((Command *)local_410);
                      _Unwind_Resume(uVar23);
                    }
                    if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) {
                      std::__throw_out_of_range("stoi");
                    }
                    if (*piVar20 == 0) {
                      *piVar20 = iVar14;
                    }
                    iVar15 = 1;
                    if ((long)local_368 - (long)paVar6 ==
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar35]._M_string_length) {
                      iVar15 = (int)lVar21;
                      if (iVar15 < 1) {
                        local_368 = (undefined1  [8])&local_358;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_368,
                                   "sub-command TRANSFORM, selector FOR expects positive numeric value for <step>."
                                   ,"");
                        std::__cxx11::string::_M_assign((string *)psVar19);
                        goto LAB_003a1902;
                      }
                      uVar35 = uVar34 + 4;
                    }
                  }
                  _Var22._M_head_impl = (TransformSelector *)operator_new(0x50);
                  (((string *)((long)_Var22._M_head_impl + 8))->_M_dataplus)._M_p =
                       (pointer)((long)_Var22._M_head_impl + 0x18);
                  *(undefined4 *)((long)_Var22._M_head_impl + 0x18) = 0x524f46;
                  *(size_type *)((long)_Var22._M_head_impl + 0x10) = 3;
                  ((TransformSelector *)((long)_Var22._M_head_impl + 0x28))->_vptr_TransformSelector
                       = (_func_int **)0x0;
                  (((string *)((long)_Var22._M_head_impl + 0x30))->_M_dataplus)._M_p = (pointer)0x0;
                  *(size_type *)((long)_Var22._M_head_impl + 0x38) = 0;
                  *(undefined ***)_Var22._M_head_impl = &PTR__TransformSelectorIndexes_00950790;
                  *(int *)((long)_Var22._M_head_impl + 0x40) = (int)lVar27;
                  *(int *)((long)_Var22._M_head_impl + 0x44) = (int)local_148;
                  *(int *)((long)_Var22._M_head_impl + 0x48) = iVar15;
                  if (local_3b0._M_head_impl != (TransformSelector *)0x0) {
                    lVar27 = *(long *)local_3b0._M_head_impl;
                    local_3b0._M_head_impl = _Var22._M_head_impl;
                    (**(code **)(lVar27 + 8))();
                    _Var22._M_head_impl = local_3b0._M_head_impl;
                  }
                  goto LAB_003a0e64;
                }
              }
              local_368 = (undefined1  [8])&local_358;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_368,
                         "sub-command TRANSFORM, selector FOR expects, at least, two numeric values."
                         ,"");
              std::__cxx11::string::_M_assign((string *)psVar19);
            }
            else {
              if ((__n != local_160) ||
                 ((__n != 0 &&
                  (iVar14 = bcmp((pbVar1->_M_dataplus)._M_p,local_168,__n), iVar14 != 0)))) {
                local_368 = (undefined1  [8])0x18;
                pcStack_360 = "sub-command TRANSFORM, \'";
                separator_00._M_str = " ";
                separator_00._M_len = 1;
                local_40.Begin._M_current = pbVar1;
                local_40.End._M_current = pbVar28;
                cmJoin(&local_140,&local_40,separator_00,(string_view)ZEXT816(0));
                local_5e8._0_8_ = local_140._M_string_length;
                local_5e8._8_8_ = local_140._M_dataplus._M_p;
                cmStrCat<char[27]>((string *)(local_518 + 0x28),(cmAlphaNum *)local_368,
                                   (cmAlphaNum *)local_5e8,
                                   (char (*) [27])"\': unexpected argument(s).");
                std::__cxx11::string::_M_assign((string *)psVar19);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(auStack_4ec._0_4_,local_518._40_4_) != &local_4e0) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(auStack_4ec._0_4_,local_518._40_4_),
                                  (ulong)(local_4e0._M_allocated_capacity + 1));
                }
                local_4e0._M_allocated_capacity = local_140.field_2._M_allocated_capacity;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_140._M_dataplus._M_p != &local_140.field_2) goto LAB_003a1917;
                goto LAB_003a191f;
              }
              if (uVar32 != uVar34 + 1) {
                std::__cxx11::string::_M_assign((string *)&((Command *)local_410)->OutputName);
                goto LAB_003a09c2;
              }
              local_368 = (undefined1  [8])&local_358;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_368,
                         "sub-command TRANSFORM, OUTPUT_VARIABLE expects variable name argument.",""
                        );
              std::__cxx11::string::_M_assign((string *)psVar19);
            }
LAB_003a1902:
            if (local_368 != (undefined1  [8])&local_358) {
LAB_003a190f:
              local_4e0._M_allocated_capacity =
                   (size_type)
                   (pointer)CONCAT26(local_358._M_allocated_capacity._6_2_,
                                     CONCAT15(local_358._M_local_buf[5],
                                              CONCAT14(local_358._M_local_buf[4],
                                                       CONCAT13(local_358._M_local_buf[3],
                                                                CONCAT12(local_358._M_local_buf[2],
                                                                         CONCAT11(local_358.
                                                                                  _M_local_buf[1],
                                                                                  local_358.
                                                                                  _M_local_buf[0])))
                                                      )));
              local_140._M_dataplus._M_p = (pointer)local_368;
              goto LAB_003a1917;
            }
            goto LAB_003a191f;
          }
          local_5e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_5e8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_5e8._16_8_ = (pointer)0x0;
          uVar35 = uVar34 + 1;
          if (uVar35 < (ulong)((long)pbVar28 - (long)pbVar37 >> 5)) {
            piVar20 = __errno_location();
            do {
              paVar6 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         **)((long)&pbVar37[1]._M_dataplus._M_p + lVar27);
              iVar14 = *piVar20;
              *piVar20 = 0;
              lVar21 = strtol(paVar6->_M_local_buf,(char **)local_368,10);
              if (local_368 == (undefined1  [8])paVar6) {
                uVar23 = std::__throw_invalid_argument("stoi");
                goto LAB_003a148e;
              }
              if ((lVar21 - 0x80000000U < 0xffffffff00000000) || (*piVar20 == 0x22)) {
                std::__throw_out_of_range("stoi");
              }
              if (*piVar20 == 0) {
                *piVar20 = iVar14;
              }
              local_518._40_4_ = (undefined4)lVar21;
              if ((long)local_368 - (long)paVar6 !=
                  *(long *)((long)&(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[1]._M_string_length +
                           lVar27)) break;
              if (local_5e8._8_8_ == local_5e8._16_8_) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)local_5e8,(iterator)local_5e8._8_8_,
                           (int *)(local_518 + 0x28));
              }
              else {
                *(undefined4 *)local_5e8._8_8_ = local_518._40_4_;
                local_5e8._8_8_ = local_5e8._8_8_ + 4;
              }
              pbVar37 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              uVar35 = uVar35 + 1;
              lVar27 = lVar27 + 0x20;
            } while (uVar35 < (ulong)((long)(args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pbVar37 >> 5));
          }
          uVar11 = local_5e8._8_8_;
          uVar23 = local_5e8._0_8_;
          if (local_5e8._0_8_ == local_5e8._8_8_) {
            local_368 = (undefined1  [8])&local_358;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_368,
                       "sub-command TRANSFORM, selector AT expects at least one numeric value.","");
            std::__cxx11::string::_M_assign((string *)psVar19);
            _Var22._M_head_impl = local_3b0._M_head_impl;
            if (local_368 != (undefined1  [8])&local_358) {
              operator_delete((void *)local_368,
                              CONCAT26(local_358._M_allocated_capacity._6_2_,
                                       CONCAT15(local_358._M_local_buf[5],
                                                CONCAT14(local_358._M_local_buf[4],
                                                         CONCAT13(local_358._M_local_buf[3],
                                                                  CONCAT12(local_358._M_local_buf[2]
                                                                           ,CONCAT11(local_358.
                                                                                     _M_local_buf[1]
                                                                                     ,local_358.
                                                                                      _M_local_buf
                                                                                      [0])))))) + 1)
              ;
              _Var22._M_head_impl = local_3b0._M_head_impl;
            }
          }
          else {
            _Var22._M_head_impl = (TransformSelector *)operator_new(0x40);
            local_358._M_local_buf[1] = 'T';
            local_358._M_local_buf[2] = '\0';
            ((_Var22._M_head_impl)->Tag)._M_dataplus._M_p =
                 (pointer)&((_Var22._M_head_impl)->Tag).field_2;
            ((_Var22._M_head_impl)->Tag).field_2._M_allocated_capacity =
                 CONCAT26(local_358._M_allocated_capacity._6_2_,
                          CONCAT15(local_358._M_local_buf[5],
                                   CONCAT14(local_358._M_local_buf[4],
                                            CONCAT13(local_358._M_local_buf[3],0x5441))));
            *(ulong *)((long)&((_Var22._M_head_impl)->Tag).field_2 + 8) =
                 CONCAT17(local_358._M_local_buf[0xf],CONCAT25(local_358._13_2_,local_358._8_5_));
            ((_Var22._M_head_impl)->Tag)._M_string_length = 2;
            pcStack_360 = (char *)0x0;
            local_358._M_local_buf[0] = '\0';
            (_Var22._M_head_impl)->_vptr_TransformSelector =
                 (_func_int **)&PTR__TransformSelectorIndexes_00950758;
            local_368 = (undefined1  [8])&local_358;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)(_Var22._M_head_impl + 1),
                       (vector<int,_std::allocator<int>_> *)local_5e8);
            if (local_368 != (undefined1  [8])&local_358) {
              operator_delete((void *)local_368,
                              CONCAT26(local_358._M_allocated_capacity._6_2_,
                                       CONCAT15(local_358._M_local_buf[5],
                                                CONCAT14(local_358._M_local_buf[4],
                                                         CONCAT13(local_358._M_local_buf[3],
                                                                  CONCAT12(local_358._M_local_buf[2]
                                                                           ,CONCAT11(local_358.
                                                                                     _M_local_buf[1]
                                                                                     ,local_358.
                                                                                      _M_local_buf
                                                                                      [0])))))) + 1)
              ;
            }
            (_Var22._M_head_impl)->_vptr_TransformSelector =
                 (_func_int **)&PTR__TransformSelectorIndexes_009506f0;
            if ((tuple<(anonymous_namespace)::TransformSelector_*,_std::default_delete<(anonymous_namespace)::TransformSelector>_>
                 )local_3b0._M_head_impl !=
                (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
              ppp_Var10 = &(local_3b0._M_head_impl)->_vptr_TransformSelector;
              local_3b0._M_head_impl = _Var22._M_head_impl;
              (*(*ppp_Var10)[1])();
              _Var22._M_head_impl = local_3b0._M_head_impl;
            }
          }
          local_3b0._M_head_impl = _Var22._M_head_impl;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_5e8._0_8_,local_5e8._16_8_ - local_5e8._0_8_);
          }
          _Var22._M_head_impl = local_3b0._M_head_impl;
          if (uVar23 == uVar11) goto LAB_003a191f;
LAB_003a0e64:
          local_3b0._M_head_impl = _Var22._M_head_impl;
          pbVar37 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar28 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          uVar32 = (long)pbVar28 - (long)pbVar37 >> 5;
          uVar34 = uVar35;
        } while (uVar35 < uVar32);
      }
      local_5e8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_5e8._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_5e8._16_8_ = (pointer)0x0;
      bVar12 = GetList((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5e8,&((Command *)local_410)->ListName,status->Makefile);
      if (bVar12) {
        if (local_3b0._M_head_impl == (TransformSelector *)0x0) {
          local_3b0._M_head_impl = (TransformSelector *)operator_new(0x28);
          (((string *)((long)local_3b0._M_head_impl + 8))->_M_dataplus)._M_p =
               (pointer)((long)local_3b0._M_head_impl + 0x18);
          ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)local_3b0._M_head_impl + 0x18))->_M_allocated_capacity = 0x43454c4553204f4e;
          *(undefined4 *)((long)local_3b0._M_head_impl + 0x1f) = 0x524f5443;
          *(undefined1 *)((long)local_3b0._M_head_impl + 0x23) = 0;
          *(size_type *)((long)local_3b0._M_head_impl + 0x10) = 0xb;
          ppuVar24 = &PTR__TransformSelector_009507e0;
          *(undefined ***)local_3b0._M_head_impl = &PTR__TransformSelector_009507e0;
        }
        else {
          ppuVar24 = (local_3b0._M_head_impl)->_vptr_TransformSelector;
        }
        (*((_func_int **)ppuVar24)[4])(local_3b0._M_head_impl,local_5e8,&p_Var26[2]._M_parent);
        pcVar4 = status->Makefile;
        separator._M_str = ";";
        separator._M_len = 1;
        cmJoin((string *)local_368,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5e8,separator,(string_view)ZEXT816(0));
        value_00._M_str = (char *)local_368;
        value_00._M_len = (size_t)pcStack_360;
        cmMakefile::AddDefinition(pcVar4,&((Command *)local_410)->OutputName,value_00);
        if (local_368 != (undefined1  [8])&local_358) {
          operator_delete((void *)local_368,
                          CONCAT26(local_358._M_allocated_capacity._6_2_,
                                   CONCAT15(local_358._M_local_buf[5],
                                            CONCAT14(local_358._M_local_buf[4],
                                                     CONCAT13(local_358._M_local_buf[3],
                                                              CONCAT12(local_358._M_local_buf[2],
                                                                       CONCAT11(local_358.
                                                                                _M_local_buf[1],
                                                                                local_358.
                                                                                _M_local_buf[0])))))
                                  ) + 1);
        }
      }
      else {
        cmMakefile::AddDefinition
                  (status->Makefile,&((Command *)local_410)->OutputName,
                   (string_view)(ZEXT816(0x7bf049) << 0x40));
      }
      bVar12 = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5e8);
LAB_003a1921:
      if (local_168 != local_158) {
        operator_delete(local_168,local_158[0] + 1);
      }
      if (local_388 != local_378) {
        operator_delete(local_388,local_378[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_allocated_capacity != &local_588) {
        operator_delete((void *)local_598._M_allocated_capacity,local_588._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
        operator_delete(local_5b8._M_dataplus._M_p,
                        (ulong)(local_5b8.field_2._M_allocated_capacity + 1));
      }
      goto LAB_003a19ac;
    }
    uVar23 = *(undefined8 *)(p_Var26 + 1);
    p_Var31 = p_Var26[1]._M_parent;
    local_368 = (undefined1  [8])&DAT_0000001e;
    pcStack_360 = "sub-command TRANSFORM, action ";
    local_358._M_local_buf[0] = (char)p_Var31;
    local_358._M_local_buf[1] = (char)((ulong)p_Var31 >> 8);
    local_358._M_local_buf[2] = (char)((ulong)p_Var31 >> 0x10);
    local_358._M_local_buf[3] = (char)((ulong)p_Var31 >> 0x18);
    local_358._M_local_buf[4] = (char)((ulong)p_Var31 >> 0x20);
    local_358._M_local_buf[5] = (char)((ulong)p_Var31 >> 0x28);
    local_358._M_allocated_capacity._6_2_ = (undefined2)((ulong)p_Var31 >> 0x30);
    local_358._8_5_ = (undefined5)uVar23;
    local_358._13_2_ = (undefined2)((ulong)uVar23 >> 0x28);
    local_358._M_local_buf[0xf] = (char)((ulong)uVar23 >> 0x38);
    local_348 = 9;
    local_340 = (undefined1  [8])0x7794d9;
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_5e8,p_Var26[2]._M_color);
    paStack_338 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5e8._0_8_;
    local_330 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5e8._8_8_;
    pcStack_328 = (code *)0xd;
    local_320 = " argument(s).";
    views._M_len = 5;
    views._M_array = (iterator)local_368;
    cmCatViews_abi_cxx11_(&local_5b8,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    _Var30._M_p = local_5b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) goto LAB_003a04b4;
  }
  bVar12 = false;
LAB_003a19ac:
  std::
  set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
  ::~set((set<ActionDescriptor,_std::function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<ActionDescriptor>_>
          *)&local_538);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &(((Command *)local_410)->OutputName).field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)local_3b0._M_head_impl !=
      (_Head_base<0UL,_(anonymous_namespace)::TransformSelector_*,_false>)0x0) {
    (*(local_3b0._M_head_impl)->_vptr_TransformSelector[1])();
  }
  local_3b0._M_head_impl = (TransformSelector *)0x0;
  if ((_Tuple_impl<0UL,_(anonymous_namespace)::TransformAction_*,_std::default_delete<(anonymous_namespace)::TransformAction>_>
       )_Stack_3b8._M_head_impl != (TransformAction *)0x0) {
    (*(_Stack_3b8._M_head_impl)->_vptr_TransformAction[1])();
  }
  _Stack_3b8._M_head_impl = (TransformAction *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&((Command *)local_410)->Arguments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &(((Command *)local_410)->ListName).field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._0_8_ != &(((Command *)local_410)->Name).field_2) {
    operator_delete((void *)local_410._0_8_,CONCAT71(local_410._17_7_,local_410[0x10]) + 1);
  }
  return bVar12;
}

Assistant:

bool HandleTransformCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError(
      "sub-command TRANSFORM requires an action to be specified.");
    return false;
  }

  // Structure collecting all elements of the command
  struct Command
  {
    Command(const std::string& listName)
      : ListName(listName)
      , OutputName(listName)
    {
    }

    std::string Name;
    std::string ListName;
    std::vector<std::string> Arguments;
    std::unique_ptr<TransformAction> Action;
    std::unique_ptr<TransformSelector> Selector;
    std::string OutputName;
  } command(args[1]);

  // Descriptor of action
  // Arity: number of arguments required for the action
  // Transform: lambda function implementing the action
  struct ActionDescriptor
  {
    ActionDescriptor(std::string name)
      : Name(std::move(name))
    {
    }
    ActionDescriptor(std::string name, int arity, transform_type transform)
      : Name(std::move(name))
      , Arity(arity)
#if defined(__GNUC__) && __GNUC__ == 6 && defined(__aarch64__)
      // std::function move constructor miscompiles on this architecture
      , Transform(transform)
#else
      , Transform(std::move(transform))
#endif
    {
    }

    operator const std::string&() const { return this->Name; }

    std::string Name;
    int Arity = 0;
    transform_type Transform;
  };

  // Build a set of supported actions.
  std::set<ActionDescriptor,
           std::function<bool(const std::string&, const std::string&)>>
    descriptors(
      [](const std::string& x, const std::string& y) { return x < y; });
  descriptors = { { "APPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return s + command.Arguments[0];
                      }

                      return s;
                    } },
                  { "PREPEND", 1,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Arguments[0] + s;
                      }

                      return s;
                    } },
                  { "TOUPPER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::UpperCase(s);
                      }

                      return s;
                    } },
                  { "TOLOWER", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmSystemTools::LowerCase(s);
                      }

                      return s;
                    } },
                  { "STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmTrimWhitespace(s);
                      }

                      return s;
                    } },
                  { "GENEX_STRIP", 0,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return cmGeneratorExpression::Preprocess(
                          s,
                          cmGeneratorExpression::StripAllGeneratorExpressions);
                      }

                      return s;
                    } },
                  { "REPLACE", 2,
                    [&command](const std::string& s) -> std::string {
                      if (command.Selector->InSelection(s)) {
                        return command.Action->Transform(s);
                      }

                      return s;
                    } } };

  using size_type = std::vector<std::string>::size_type;
  size_type index = 2;

  // Parse all possible function parameters
  auto descriptor = descriptors.find(args[index]);

  if (descriptor == descriptors.end()) {
    status.SetError(
      cmStrCat(" sub-command TRANSFORM, ", args[index], " invalid action."));
    return false;
  }

  // Action arguments
  index += 1;
  if (args.size() < index + descriptor->Arity) {
    status.SetError(cmStrCat("sub-command TRANSFORM, action ",
                             descriptor->Name, " expects ", descriptor->Arity,
                             " argument(s)."));
    return false;
  }

  command.Name = descriptor->Name;
  index += descriptor->Arity;
  if (descriptor->Arity > 0) {
    command.Arguments =
      std::vector<std::string>(args.begin() + 3, args.begin() + index);
  }

  if (command.Name == "REPLACE") {
    try {
      command.Action = cm::make_unique<TransformReplace>(
        command.Arguments, &status.GetMakefile());
    } catch (const transform_error& e) {
      status.SetError(e.what());
      return false;
    }
  }

  const std::string REGEX{ "REGEX" };
  const std::string AT{ "AT" };
  const std::string FOR{ "FOR" };
  const std::string OUTPUT_VARIABLE{ "OUTPUT_VARIABLE" };

  // handle optional arguments
  while (args.size() > index) {
    if ((args[index] == REGEX || args[index] == AT || args[index] == FOR) &&
        command.Selector) {
      status.SetError(
        cmStrCat("sub-command TRANSFORM, selector already specified (",
                 command.Selector->Tag, ")."));

      return false;
    }

    // REGEX selector
    if (args[index] == REGEX) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, selector REGEX expects "
                        "'regular expression' argument.");
        return false;
      }

      command.Selector = cm::make_unique<TransformSelectorRegex>(args[index]);
      if (!command.Selector->Validate()) {
        status.SetError(
          cmStrCat("sub-command TRANSFORM, selector REGEX failed to compile "
                   "regex \"",
                   args[index], "\"."));
        return false;
      }

      index += 1;
      continue;
    }

    // AT selector
    if (args[index] == AT) {
      // get all specified indexes
      std::vector<int> indexes;
      while (args.size() > ++index) {
        std::size_t pos;
        int value;

        try {
          value = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number, stop processing
            break;
          }
          indexes.push_back(value);
        } catch (const std::invalid_argument&) {
          // this is not a number, stop processing
          break;
        }
      }

      if (indexes.empty()) {
        status.SetError(
          "sub-command TRANSFORM, selector AT expects at least one "
          "numeric value.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorAt>(std::move(indexes));

      continue;
    }

    // FOR selector
    if (args[index] == FOR) {
      if (args.size() <= ++index + 1) {
        status.SetError(
          "sub-command TRANSFORM, selector FOR expects, at least,"
          " two arguments.");
        return false;
      }

      int start = 0;
      int stop = 0;
      int step = 1;
      bool valid = true;
      try {
        std::size_t pos;

        start = std::stoi(args[index], &pos);
        if (pos != args[index].length()) {
          // this is not a number
          valid = false;
        } else {
          stop = std::stoi(args[++index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            valid = false;
          }
        }
      } catch (const std::invalid_argument&) {
        // this is not numbers
        valid = false;
      }
      if (!valid) {
        status.SetError("sub-command TRANSFORM, selector FOR expects, "
                        "at least, two numeric values.");
        return false;
      }
      // try to read a third numeric value for step
      if (args.size() > ++index) {
        try {
          std::size_t pos;

          step = std::stoi(args[index], &pos);
          if (pos != args[index].length()) {
            // this is not a number
            step = 1;
          } else {
            index += 1;
          }
        } catch (const std::invalid_argument&) {
          // this is not number, ignore exception
        }
      }

      if (step <= 0) {
        status.SetError("sub-command TRANSFORM, selector FOR expects "
                        "positive numeric value for <step>.");
        return false;
      }

      command.Selector =
        cm::make_unique<TransformSelectorFor>(start, stop, step);

      continue;
    }

    // output variable
    if (args[index] == OUTPUT_VARIABLE) {
      if (args.size() == ++index) {
        status.SetError("sub-command TRANSFORM, OUTPUT_VARIABLE "
                        "expects variable name argument.");
        return false;
      }

      command.OutputName = args[index++];
      continue;
    }

    status.SetError(cmStrCat("sub-command TRANSFORM, '",
                             cmJoin(cmMakeRange(args).advance(index), " "),
                             "': unexpected argument(s)."));
    return false;
  }

  // expand the list variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, command.ListName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(command.OutputName, "");
    return true;
  }

  if (!command.Selector) {
    // no selector specified, apply transformation to all elements
    command.Selector = cm::make_unique<TransformNoSelector>();
  }

  try {
    command.Selector->Transform(varArgsExpanded, descriptor->Transform);
  } catch (const transform_error& e) {
    status.SetError(e.what());
    return false;
  }

  status.GetMakefile().AddDefinition(command.OutputName,
                                     cmJoin(varArgsExpanded, ";"));

  return true;
}